

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::
SmallVectorBase<std::pair<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::NodeRef>_>
::reallocateTo(SmallVectorBase<std::pair<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::NodeRef>_>
               *this,size_type newCapacity)

{
  undefined8 *puVar1;
  pointer ppVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer ppVar5;
  long lVar6;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)newCapacity;
  ppVar5 = (pointer)operator_new(newCapacity << 4);
  ppVar2 = this->data_;
  sVar3 = this->len;
  for (lVar6 = 0; sVar3 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
    ctx = (EVP_PKEY_CTX *)((long)&(ppVar2->first).pip.value + lVar6);
    puVar1 = (undefined8 *)((long)&(ppVar5->first).pip.value + lVar6);
    uVar4 = *(undefined8 *)(ctx + 8);
    *puVar1 = *(undefined8 *)ctx;
    puVar1[1] = uVar4;
  }
  cleanup(this,ctx);
  this->cap = newCapacity;
  this->data_ = ppVar5;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }